

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O2

void __thiscall asl::Var::free(Var *this,void *__ptr)

{
  Type TVar1;
  
  TVar1 = this->_type;
  if (TVar1 == DIC) {
    Array<asl::Map<asl::String,_asl::Var>::KeyVal>::~Array
              ((Array<asl::Map<asl::String,_asl::Var>::KeyVal> *)&(this->field_1)._a);
  }
  else if (TVar1 == ARRAY) {
    Array<asl::Var>::~Array((Array<asl::Var> *)&(this->field_1)._a);
  }
  else if (TVar1 == STRING) {
    Array<char>::~Array((Array<char> *)&(this->field_1)._a);
  }
  this->_type = NONE;
  return;
}

Assistant:

void Var::free()
{
	switch(_type) {
	case STRING: DEL_STRING(_s); break;
	case ARRAY: DEL_ARRAY(_a); break;
	case OBJ: DEL_DIC(_o); break;
	default: break;
	}
	_type=NONE;
}